

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-all.c
# Opt level: O3

void tb_page_remove(PageDesc *pd,TranslationBlock_conflict *tb)

{
  ulong uVar1;
  TranslationBlock_conflict *pTVar2;
  TranslationBlock_conflict *pTVar3;
  uint uVar4;
  
  uVar1 = pd->first_tb;
  pTVar2 = (TranslationBlock_conflict *)(uVar1 & 0xfffffffffffffffe);
  if (pTVar2 != (TranslationBlock_conflict *)0x0) {
    if (pTVar2 != tb) {
      do {
        pTVar3 = pTVar2;
        uVar4 = (uint)uVar1 & 1;
        uVar1 = pTVar3->page_next[uVar4];
        pTVar2 = (TranslationBlock_conflict *)(uVar1 & 0xfffffffffffffffe);
        if (pTVar2 == (TranslationBlock_conflict *)0x0) goto LAB_00d19e65;
      } while (pTVar2 != tb);
      pd = (PageDesc *)(pTVar3->page_next + uVar4);
    }
    pd->first_tb = pTVar2->page_next[(uint)uVar1 & 1];
    return;
  }
LAB_00d19e65:
  g_assertion_message_expr
            ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/accel/tcg/translate-all.c"
             ,0x586,(char *)0x0);
}

Assistant:

static inline void tb_page_remove(PageDesc *pd, TranslationBlock *tb)
{
    TranslationBlock *tb1;
    uintptr_t *pprev;
    unsigned int n1;

    assert_page_locked(pd);
    pprev = &pd->first_tb;
    PAGE_FOR_EACH_TB(pd, tb1, n1) {
        if (tb1 == tb) {
            *pprev = tb1->page_next[n1];
            return;
        }
        pprev = &tb1->page_next[n1];
    }
    g_assert_not_reached();
}